

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<ProjectBuilderSources>::emplace<ProjectBuilderSources>
          (QGenericArrayOps<ProjectBuilderSources> *this,qsizetype i,ProjectBuilderSources *args)

{
  ProjectBuilderSources **ppPVar1;
  qsizetype *pqVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  Data *pDVar5;
  long lVar6;
  ProjectBuilderSources *pPVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  undefined8 uVar11;
  Data *pDVar12;
  char16_t *pcVar13;
  qsizetype qVar14;
  Data *pDVar15;
  char16_t *pcVar16;
  qsizetype qVar17;
  long in_FS_OFFSET;
  bool bVar18;
  Inserter local_c8;
  ProjectBuilderSources local_78;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QArrayDataPointer<ProjectBuilderSources>).d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0014d420:
    uVar3 = args->buildable;
    uVar4 = args->object_output;
    local_78.object_output = (bool)uVar4;
    local_78.buildable = (bool)uVar3;
    local_78._2_6_ = 0xaaaaaaaaaaaa;
    local_78.key.d.d = (args->key).d.d;
    local_78.key.d.ptr = (args->key).d.ptr;
    (args->key).d.d = (Data *)0x0;
    (args->key).d.ptr = (char16_t *)0x0;
    local_78.key.d.size = (args->key).d.size;
    (args->key).d.size = 0;
    local_78.group.d.d = (args->group).d.d;
    local_78.group.d.ptr = (args->group).d.ptr;
    (args->group).d.d = (Data *)0x0;
    (args->group).d.ptr = (char16_t *)0x0;
    local_78.group.d.size = (args->group).d.size;
    (args->group).d.size = 0;
    local_78.compiler.d.d = (args->compiler).d.d;
    local_78.compiler.d.ptr = (args->compiler).d.ptr;
    (args->compiler).d.d = (Data *)0x0;
    (args->compiler).d.ptr = (char16_t *)0x0;
    local_78.compiler.d.size = (args->compiler).d.size;
    (args->compiler).d.size = 0;
    bVar18 = (this->super_QArrayDataPointer<ProjectBuilderSources>).size != 0;
    QArrayDataPointer<ProjectBuilderSources>::detachAndGrow
              (&this->super_QArrayDataPointer<ProjectBuilderSources>,(uint)(i == 0 && bVar18),1,
               (ProjectBuilderSources **)0x0,(QArrayDataPointer<ProjectBuilderSources> *)0x0);
    qVar17 = local_78.compiler.d.size;
    pcVar16 = local_78.compiler.d.ptr;
    pDVar15 = local_78.compiler.d.d;
    qVar14 = local_78.group.d.size;
    pcVar13 = local_78.group.d.ptr;
    pDVar12 = local_78.group.d.d;
    qVar10 = local_78.key.d.size;
    pcVar9 = local_78.key.d.ptr;
    pDVar8 = local_78.key.d.d;
    uVar11 = local_78._0_8_;
    if (i == 0 && bVar18) {
      pPVar7 = (this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
      pPVar7[-1].buildable = local_78.buildable;
      pPVar7[-1].object_output = local_78.object_output;
      local_78.key.d.d = (Data *)0x0;
      pPVar7[-1].key.d.d = pDVar8;
      local_78.key.d.ptr = (char16_t *)0x0;
      pPVar7[-1].key.d.ptr = pcVar9;
      local_78.key.d.size = 0;
      pPVar7[-1].key.d.size = qVar10;
      local_78.group.d.d = (Data *)0x0;
      pPVar7[-1].group.d.d = pDVar12;
      local_78.group.d.ptr = (char16_t *)0x0;
      pPVar7[-1].group.d.ptr = pcVar13;
      local_78.group.d.size = 0;
      pPVar7[-1].group.d.size = qVar14;
      local_78.compiler.d.d = (Data *)0x0;
      pPVar7[-1].compiler.d.d = pDVar15;
      local_78.compiler.d.ptr = (char16_t *)0x0;
      pPVar7[-1].compiler.d.ptr = pcVar16;
      local_78.compiler.d.size = 0;
      pPVar7[-1].compiler.d.size = qVar17;
      ppPVar1 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
      *ppPVar1 = *ppPVar1 + -1;
      pqVar2 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).size;
      *pqVar2 = *pqVar2 + 1;
      local_78._0_8_ = uVar11;
    }
    else {
      local_c8.sourceCopyConstruct = 0;
      local_c8.nSource = 0;
      local_c8.move = 0;
      local_c8.sourceCopyAssign = 0;
      local_c8.end = (ProjectBuilderSources *)0x0;
      local_c8.last = (ProjectBuilderSources *)0x0;
      local_c8.where = (ProjectBuilderSources *)0x0;
      local_c8.begin = (this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
      local_c8.size = (this->super_QArrayDataPointer<ProjectBuilderSources>).size;
      local_c8.data = &this->super_QArrayDataPointer<ProjectBuilderSources>;
      Inserter::insertOne(&local_c8,i,&local_78);
      (local_c8.data)->ptr = local_c8.begin;
      (local_c8.data)->size = local_c8.size;
    }
    if (&(local_78.compiler.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.compiler.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.compiler.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.compiler.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.compiler.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.group.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.group.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.group.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_78.group.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_78.group.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.key.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    lVar6 = (this->super_QArrayDataPointer<ProjectBuilderSources>).size;
    if ((lVar6 == i && pDVar5 != (Data *)0x0) &&
       ((pDVar5->super_QArrayData).alloc - lVar6 !=
        ((long)((long)(this->super_QArrayDataPointer<ProjectBuilderSources>).ptr -
               ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x3333333333333333)) {
      pPVar7 = (this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
      bVar18 = args->object_output;
      pPVar7[lVar6].buildable = args->buildable;
      pPVar7[lVar6].object_output = bVar18;
      pDVar8 = (args->key).d.d;
      (args->key).d.d = (Data *)0x0;
      pPVar7[lVar6].key.d.d = pDVar8;
      pcVar9 = (args->key).d.ptr;
      (args->key).d.ptr = (char16_t *)0x0;
      pPVar7[lVar6].key.d.ptr = pcVar9;
      qVar10 = (args->key).d.size;
      (args->key).d.size = 0;
      pPVar7[lVar6].key.d.size = qVar10;
      pDVar8 = (args->group).d.d;
      (args->group).d.d = (Data *)0x0;
      pPVar7[lVar6].group.d.d = pDVar8;
      pcVar9 = (args->group).d.ptr;
      (args->group).d.ptr = (char16_t *)0x0;
      pPVar7[lVar6].group.d.ptr = pcVar9;
      qVar10 = (args->group).d.size;
      (args->group).d.size = 0;
      pPVar7[lVar6].group.d.size = qVar10;
      pDVar8 = (args->compiler).d.d;
      (args->compiler).d.d = (Data *)0x0;
      pPVar7[lVar6].compiler.d.d = pDVar8;
      pcVar9 = (args->compiler).d.ptr;
      (args->compiler).d.ptr = (char16_t *)0x0;
      pPVar7[lVar6].compiler.d.ptr = pcVar9;
      qVar10 = (args->compiler).d.size;
      (args->compiler).d.size = 0;
      pPVar7[lVar6].compiler.d.size = qVar10;
    }
    else {
      if (((i != 0) || (pDVar5 == (Data *)0x0)) ||
         ((ProjectBuilderSources *)
          ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<ProjectBuilderSources>).ptr)) goto LAB_0014d420;
      pPVar7 = (this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
      bVar18 = args->object_output;
      pPVar7[-1].buildable = args->buildable;
      pPVar7[-1].object_output = bVar18;
      pDVar8 = (args->key).d.d;
      (args->key).d.d = (Data *)0x0;
      pPVar7[-1].key.d.d = pDVar8;
      pcVar9 = (args->key).d.ptr;
      (args->key).d.ptr = (char16_t *)0x0;
      pPVar7[-1].key.d.ptr = pcVar9;
      qVar10 = (args->key).d.size;
      (args->key).d.size = 0;
      pPVar7[-1].key.d.size = qVar10;
      pDVar8 = (args->group).d.d;
      (args->group).d.d = (Data *)0x0;
      pPVar7[-1].group.d.d = pDVar8;
      pcVar9 = (args->group).d.ptr;
      (args->group).d.ptr = (char16_t *)0x0;
      pPVar7[-1].group.d.ptr = pcVar9;
      qVar10 = (args->group).d.size;
      (args->group).d.size = 0;
      pPVar7[-1].group.d.size = qVar10;
      pDVar8 = (args->compiler).d.d;
      (args->compiler).d.d = (Data *)0x0;
      pPVar7[-1].compiler.d.d = pDVar8;
      pcVar9 = (args->compiler).d.ptr;
      (args->compiler).d.ptr = (char16_t *)0x0;
      pPVar7[-1].compiler.d.ptr = pcVar9;
      qVar10 = (args->compiler).d.size;
      (args->compiler).d.size = 0;
      pPVar7[-1].compiler.d.size = qVar10;
      ppPVar1 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
      *ppPVar1 = *ppPVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }